

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O1

void __thiscall
ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)3>::metric_pair::
metric_pair<std::array<std::__cxx11::string,3ul>const&>
          (metric_pair *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *first)

{
  long lVar1;
  atomic<long> *paVar2;
  undefined8 uVar3;
  long lVar4;
  metric_pair *pmVar5;
  
  lVar4 = 0x10;
  pmVar5 = this;
  do {
    *(string **)pmVar5 = (string *)pmVar5 + 0x10;
    lVar1 = *(long *)((long)first->_M_elems + lVar4 + -0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)pmVar5,lVar1,*(long *)((long)first->_M_elems + lVar4 + -8) + lVar1);
    lVar4 = lVar4 + 0x20;
    pmVar5 = (metric_pair *)((string *)pmVar5 + 0x20);
  } while (lVar4 != 0x70);
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  paVar2 = thread_local_value<long>::local_value(dynamic_metric::g_user_metric_label_count);
  LOCK();
  (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  if (ylt_label_max_age != 0) {
    uVar3 = std::chrono::_V2::steady_clock::now();
    *(undefined8 *)(this + 0x68) = uVar3;
  }
  return;
}

Assistant:

metric_pair(T&& first, Args&&... args)
        : label(std::forward<T>(first)), value(std::forward<Args>(args)...) {
      g_user_metric_label_count->inc();
      if (ylt_label_max_age.count()) {
        tp = std::chrono::steady_clock::now();
      }
    }